

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::DirectoryTreeStructureSignatureTask::start
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti)

{
  bool bVar1;
  BuildKey *this_00;
  char *pcVar2;
  StringList *in_R8;
  StringRef path;
  StringRef path_00;
  BuildKey local_d0;
  KeyType local_b0;
  BuildKey *local_90;
  BuildKey local_80;
  KeyType local_60;
  DirectoryTreeStructureSignatureTask *local_40;
  DirectoryTreeStructureSignatureTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryTreeStructureSignatureTask *)ti.impl;
  local_40 = this;
  bVar1 = llbuild::basic::StringList::isEmpty(&this->filters);
  if (bVar1) {
    ti_local.ctx = &this->path;
    local_90 = (BuildKey *)std::__cxx11::string::data();
    pcVar2 = (char *)std::__cxx11::string::length();
    path.Length = (size_t)pcVar2;
    path.Data = pcVar2;
    llbuild::buildsystem::BuildKey::makeDirectoryContents(&local_80,local_90,path);
    llbuild::buildsystem::BuildKey::toData(&local_60,&local_80);
    llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_60,0);
    llbuild::core::KeyType::~KeyType(&local_60);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_80);
  }
  else {
    this_00 = (BuildKey *)std::__cxx11::string::data();
    pcVar2 = (char *)std::__cxx11::string::length();
    path_00.Length = &this->filters;
    path_00.Data = pcVar2;
    llbuild::buildsystem::BuildKey::makeFilteredDirectoryContents(&local_d0,this_00,path_00,in_R8);
    llbuild::buildsystem::BuildKey::toData(&local_b0,&local_d0);
    llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_b0,0);
    llbuild::core::KeyType::~KeyType(&local_b0);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_d0);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Ask for the base directory directory contents.
    if (filters.isEmpty()) {
      ti.request(BuildKey::makeDirectoryContents(path).toData(), /*inputID=*/0);
    } else {
      ti.request(BuildKey::makeFilteredDirectoryContents(path, filters).toData(),
                 /*inputID=*/0);
    }
  }